

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack8.h
# Opt level: O1

void ncnn::conv3x3s1_winograd63_pack8_avx
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Mat *bias,Option *opt)

{
  float *pfVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  int iVar8;
  int iVar9;
  int outch;
  size_t _elemsize;
  int *piVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [32];
  int iVar28;
  int _h;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  undefined4 uVar39;
  undefined4 uVar40;
  undefined4 uVar41;
  undefined4 uVar42;
  undefined4 uVar43;
  int iVar44;
  Option *opt_00;
  int w_tiles;
  long lVar45;
  ulong uVar46;
  Mat *pMVar47;
  long lVar48;
  float *pfVar49;
  long lVar50;
  long lVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float in_register_0000151c;
  float fVar99;
  float in_register_0000155c;
  long local_848;
  long local_838;
  Mat local_830;
  Mat *local_7e0;
  long local_7d8;
  Mat *local_7d0;
  ulong local_7c8;
  Mat *local_7c0;
  long local_7b8;
  Mat local_7b0;
  undefined1 local_760 [32];
  undefined8 local_740;
  float afStack_738 [6];
  size_t local_720 [2];
  Mat local_710;
  long local_6c0;
  long local_6b8;
  long local_6b0;
  long local_6a8;
  long local_6a0;
  long local_698;
  long local_690;
  long local_688;
  void *local_680;
  long local_678;
  long local_670;
  long local_668;
  float afStack_660 [396];
  
  iVar44 = bottom_blob->c;
  _elemsize = bottom_blob->elemsize;
  local_7b0.elempack = bottom_blob->elempack;
  iVar8 = top_blob->w;
  iVar9 = top_blob->h;
  outch = top_blob->c;
  piVar10 = bottom_blob->refcount;
  local_7b0.data = bottom_blob->data;
  local_7b0.refcount._0_4_ = SUB84(bottom_blob->refcount,0);
  local_7b0.refcount._4_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  local_7b0.elemsize._0_4_ = (undefined4)_elemsize;
  local_7b0.elemsize._4_4_ = (undefined4)(_elemsize >> 0x20);
  local_7c8 = CONCAT44(local_7c8._4_4_,local_7b0.elempack);
  local_7b0.allocator = bottom_blob->allocator;
  uVar36 = bottom_blob->dims;
  uVar37 = bottom_blob->w;
  uVar38 = bottom_blob->h;
  uVar39 = bottom_blob->d;
  local_7b0.cstep = bottom_blob->cstep;
  if (piVar10 != (int *)0x0) {
    LOCK();
    *piVar10 = *piVar10 + 1;
    UNLOCK();
  }
  iVar8 = (iVar8 + 5) / 6;
  iVar28 = iVar8 * 6;
  iVar9 = (iVar9 + 5) / 6;
  _h = iVar9 * 6;
  local_7d8 = CONCAT44(local_7d8._4_4_,iVar28);
  local_7e0 = bias;
  local_7d0 = kernel_tm;
  local_7c0 = top_blob;
  local_7b0.dims = uVar36;
  local_7b0.w = uVar37;
  local_7b0.h = uVar38;
  local_7b0.d = uVar39;
  local_7b0.c = iVar44;
  copy_make_border(bottom_blob,&local_7b0,0,(_h - bottom_blob->h) + 2,0,
                   (iVar28 - bottom_blob->w) + 2,0,0.0,opt);
  local_710.cstep = 0;
  local_710.data = (void *)0x0;
  local_710.refcount._0_4_ = 0;
  local_710.refcount._4_4_ = 0;
  local_710.elemsize._0_4_ = 0;
  local_710._20_8_ = 0;
  local_710.allocator = (Allocator *)0x0;
  local_710.dims = 0;
  local_710.w = 0;
  local_710.h = 0;
  local_710.d = 0;
  local_710.c = 0;
  iVar28 = (int)local_7c8;
  Mat::create(&local_710,iVar9 * iVar8,0x40,iVar44,_elemsize,(int)local_7c8,opt->workspace_allocator
             );
  conv3x3s1_winograd63_transform_input_pack8_avx(&local_7b0,&local_710,opt_00);
  pMVar47 = local_7c0;
  piVar10 = (int *)CONCAT44(local_7b0.refcount._4_4_,local_7b0.refcount._0_4_);
  if (piVar10 != (int *)0x0) {
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 == 0) {
      if (local_7b0.allocator == (Allocator *)0x0) {
        if (local_7b0.data != (void *)0x0) {
          free(local_7b0.data);
        }
      }
      else {
        (*(local_7b0.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_7b0.cstep = 0;
  local_7b0.data = (void *)0x0;
  local_7b0.refcount._0_4_ = 0;
  local_7b0.refcount._4_4_ = 0;
  local_7b0.elemsize._0_4_ = 0;
  local_7b0.elemsize._4_4_ = 0;
  local_7b0.elempack = 0;
  local_7b0.h = 0;
  local_7b0.d = 0;
  local_7b0.c = 0;
  local_7b0.allocator = (Allocator *)0x0;
  local_7b0.dims = 0;
  local_7b0.w = 0;
  local_720[0] = 0;
  local_760._0_8_ = (void *)0x0;
  local_760._8_4_ = 0;
  local_760._12_4_ = 0;
  local_760._16_4_ = 0;
  local_760._20_4_ = 0;
  local_760._24_4_ = 0;
  local_740 = (Allocator *)0x0;
  afStack_738[0] = 0.0;
  afStack_738[1] = 0.0;
  afStack_738[2] = 0.0;
  afStack_738[3] = 0.0;
  afStack_738[4] = 0.0;
  convolution_winograd_dot_pack8_avx(&local_710,outch,local_7d0,(Mat *)local_760,opt);
  local_830.cstep = 0;
  local_830.data = (void *)0x0;
  local_830.refcount._0_4_ = 0;
  local_830.refcount._4_4_ = 0;
  local_830.elemsize._0_4_ = 0;
  local_830.elemsize._4_4_ = 0;
  local_830.elempack = 0;
  local_830.allocator = (Allocator *)0x0;
  local_830.dims = 0;
  local_830.w = 0;
  local_830.h = 0;
  local_830.d = 0;
  local_830.c = 0;
  if (((int)local_7d8 == pMVar47->w) && (_h == pMVar47->h)) {
    if (&local_830 != pMVar47) {
      piVar10 = pMVar47->refcount;
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + 1;
        UNLOCK();
      }
      local_830.data = pMVar47->data;
      local_830.refcount._0_4_ = SUB84(pMVar47->refcount,0);
      local_830.refcount._4_4_ = (undefined4)((ulong)pMVar47->refcount >> 0x20);
      local_830.elemsize._0_4_ = (undefined4)pMVar47->elemsize;
      local_830.elemsize._4_4_ = (undefined4)(pMVar47->elemsize >> 0x20);
      local_830.elempack = pMVar47->elempack;
      local_830.allocator = pMVar47->allocator;
      uVar40 = pMVar47->dims;
      uVar41 = pMVar47->w;
      uVar42 = pMVar47->h;
      uVar43 = pMVar47->d;
      local_830.c = pMVar47->c;
      local_830.cstep = pMVar47->cstep;
      local_830.dims = uVar40;
      local_830.w = uVar41;
      local_830.h = uVar42;
      local_830.d = uVar43;
    }
  }
  else {
    Mat::create(&local_830,(int)local_7d8,_h,outch,_elemsize,iVar28,opt->workspace_allocator);
  }
  local_678 = (long)local_830.c;
  if (0 < local_678) {
    local_680 = local_7e0->data;
    local_688 = (long)local_830.h;
    local_7e0 = (Mat *)(ulong)(uint)(local_830.h / 6);
    local_668 = (long)local_830.w;
    local_7c8 = (ulong)(uint)(local_830.w / 6);
    iVar44 = (local_830.w / 6) * (local_830.h / 6);
    local_670 = local_7c8 * 0x20;
    local_690 = (long)(iVar44 * 8) * 4;
    local_698 = (long)(iVar44 * 0x10) * 4;
    local_6a0 = (long)(iVar44 * 0x18) * 4;
    local_6a8 = (long)(iVar44 * 0x20) * 4;
    local_6b0 = (long)(iVar44 * 0x28) * 4;
    local_6b8 = (long)(iVar44 * 0x30) * 4;
    local_6c0 = (long)(iVar44 * 0x38) * 4;
    lVar50 = 0;
    do {
      local_7b8 = lVar50;
      if (local_680 == (void *)0x0) {
        fVar54 = 0.0;
        fVar55 = 0.0;
        fVar52 = 0.0;
        fVar53 = 0.0;
        fVar56 = 0.0;
        fVar57 = 0.0;
        fVar58 = 0.0;
        fVar59 = 0.0;
      }
      else {
        pfVar49 = (float *)((long)local_680 + local_7b8 * 0x20);
        fVar52 = *pfVar49;
        fVar53 = pfVar49[1];
        fVar54 = pfVar49[2];
        fVar55 = pfVar49[3];
        fVar56 = pfVar49[4];
        fVar57 = pfVar49[5];
        fVar58 = pfVar49[6];
        fVar59 = pfVar49[7];
      }
      if (5 < local_830.h) {
        lVar50 = CONCAT44(local_760._20_4_,local_760._16_4_) * local_720[0] * local_7b8;
        local_848 = (long)local_830.data +
                    local_830.cstep *
                    CONCAT44(local_830.elemsize._4_4_,(undefined4)local_830.elemsize) * local_7b8 +
                    0xa0;
        local_7d8 = (long)local_830.w *
                    CONCAT44(local_830.elemsize._4_4_,(undefined4)local_830.elemsize) * 6;
        local_838 = 0;
        pMVar47 = (Mat *)0x0;
        do {
          local_7d0 = pMVar47;
          if (5 < local_830.w) {
            uVar46 = 0;
            lVar51 = local_838;
            do {
              lVar45 = -0x100;
              lVar48 = lVar51;
              do {
                auVar2 = *(undefined1 (*) [32])(local_760._0_8_ + lVar48 + local_690 + lVar50);
                auVar3 = *(undefined1 (*) [32])(local_760._0_8_ + lVar48 + local_698 + lVar50);
                auVar4 = *(undefined1 (*) [32])(local_760._0_8_ + lVar48 + local_6a0 + lVar50);
                auVar5 = *(undefined1 (*) [32])(local_760._0_8_ + lVar48 + local_6a8 + lVar50);
                auVar6 = *(undefined1 (*) [32])(local_760._0_8_ + lVar48 + local_6b0 + lVar50);
                auVar7 = *(undefined1 (*) [32])(local_760._0_8_ + lVar48 + local_6b8 + lVar50);
                fVar84 = auVar3._0_4_ + auVar2._0_4_;
                fVar86 = auVar3._4_4_ + auVar2._4_4_;
                fVar88 = auVar3._8_4_ + auVar2._8_4_;
                fVar90 = auVar3._12_4_ + auVar2._12_4_;
                fVar92 = auVar3._16_4_ + auVar2._16_4_;
                fVar94 = auVar3._20_4_ + auVar2._20_4_;
                fVar96 = auVar3._24_4_ + auVar2._24_4_;
                fVar98 = auVar3._28_4_ + auVar2._28_4_;
                auVar2 = vsubps_avx(auVar2,auVar3);
                fVar68 = auVar5._0_4_ + auVar4._0_4_;
                fVar69 = auVar5._4_4_ + auVar4._4_4_;
                fVar70 = auVar5._8_4_ + auVar4._8_4_;
                fVar71 = auVar5._12_4_ + auVar4._12_4_;
                fVar72 = auVar5._16_4_ + auVar4._16_4_;
                fVar73 = auVar5._20_4_ + auVar4._20_4_;
                fVar74 = auVar5._24_4_ + auVar4._24_4_;
                fVar75 = auVar5._28_4_ + auVar4._28_4_;
                auVar3 = vsubps_avx(auVar4,auVar5);
                fVar76 = auVar7._0_4_ + auVar6._0_4_;
                fVar77 = auVar7._4_4_ + auVar6._4_4_;
                fVar78 = auVar7._8_4_ + auVar6._8_4_;
                fVar79 = auVar7._12_4_ + auVar6._12_4_;
                fVar80 = auVar7._16_4_ + auVar6._16_4_;
                fVar81 = auVar7._20_4_ + auVar6._20_4_;
                fVar82 = auVar7._24_4_ + auVar6._24_4_;
                fVar83 = auVar7._28_4_ + auVar6._28_4_;
                auVar4 = vsubps_avx(auVar6,auVar7);
                pfVar49 = (float *)(local_760._0_8_ + lVar48 + lVar50);
                fVar29 = pfVar49[1];
                fVar30 = pfVar49[2];
                fVar31 = pfVar49[3];
                fVar32 = pfVar49[4];
                fVar33 = pfVar49[5];
                fVar34 = pfVar49[6];
                fVar35 = pfVar49[7];
                fVar99 = in_register_0000151c + fVar75;
                in_register_0000151c = fVar99 + fVar98 + in_register_0000155c;
                fVar11 = auVar3._0_4_;
                fVar13 = auVar3._4_4_;
                fVar15 = auVar3._8_4_;
                fVar17 = auVar3._12_4_;
                fVar19 = auVar3._16_4_;
                fVar21 = auVar3._20_4_;
                fVar23 = auVar3._24_4_;
                fVar25 = auVar3._28_4_;
                fVar12 = auVar2._0_4_;
                fVar14 = auVar2._4_4_;
                fVar16 = auVar2._8_4_;
                fVar18 = auVar2._12_4_;
                fVar20 = auVar2._16_4_;
                fVar22 = auVar2._20_4_;
                fVar24 = auVar2._24_4_;
                fVar26 = auVar2._28_4_;
                fVar85 = auVar4._0_4_;
                fVar87 = auVar4._4_4_;
                fVar89 = auVar4._8_4_;
                fVar91 = auVar4._12_4_;
                fVar93 = auVar4._16_4_;
                fVar95 = auVar4._20_4_;
                fVar97 = auVar4._24_4_;
                pfVar1 = (float *)(local_760._0_8_ + lVar48 + local_6c0 + lVar50);
                fVar60 = *pfVar1;
                fVar61 = pfVar1[1];
                fVar62 = pfVar1[2];
                fVar63 = pfVar1[3];
                fVar64 = pfVar1[4];
                fVar65 = pfVar1[5];
                fVar66 = pfVar1[6];
                fVar67 = pfVar1[7];
                *(float *)((long)afStack_660 + lVar45 + 0x100) =
                     fVar84 + *pfVar49 + fVar76 * 32.0 + fVar68;
                *(float *)((long)afStack_660 + lVar45 + 0x104) =
                     fVar86 + fVar29 + fVar77 * 32.0 + fVar69;
                *(float *)((long)afStack_660 + lVar45 + 0x108) =
                     fVar88 + fVar30 + fVar78 * 32.0 + fVar70;
                *(float *)((long)afStack_660 + lVar45 + 0x10c) =
                     fVar90 + fVar31 + fVar79 * 32.0 + fVar71;
                *(float *)((long)afStack_660 + lVar45 + 0x110) =
                     fVar92 + fVar32 + fVar80 * 32.0 + fVar72;
                *(float *)((long)afStack_660 + lVar45 + 0x114) =
                     fVar94 + fVar33 + fVar81 * 32.0 + fVar73;
                *(float *)((long)afStack_660 + lVar45 + 0x118) =
                     fVar96 + fVar34 + fVar82 * 32.0 + fVar74;
                *(float *)((long)afStack_660 + lVar45 + 0x11c) = fVar98 + fVar35 + fVar99;
                *(float *)((long)afStack_660 + lVar45 + 0x200) =
                     fVar11 + fVar11 + fVar12 + fVar85 * 16.0;
                *(float *)((long)afStack_660 + lVar45 + 0x204) =
                     fVar13 + fVar13 + fVar14 + fVar87 * 16.0;
                *(float *)((long)afStack_660 + lVar45 + 0x208) =
                     fVar15 + fVar15 + fVar16 + fVar89 * 16.0;
                *(float *)((long)afStack_660 + lVar45 + 0x20c) =
                     fVar17 + fVar17 + fVar18 + fVar91 * 16.0;
                *(float *)((long)afStack_660 + lVar45 + 0x210) =
                     fVar19 + fVar19 + fVar20 + fVar93 * 16.0;
                *(float *)((long)afStack_660 + lVar45 + 0x214) =
                     fVar21 + fVar21 + fVar22 + fVar95 * 16.0;
                *(float *)((long)afStack_660 + lVar45 + 0x218) =
                     fVar23 + fVar23 + fVar24 + fVar97 * 16.0;
                *(float *)((long)afStack_660 + lVar45 + 0x21c) = fVar25 + fVar25 + fVar26 + fVar98;
                *(float *)((long)afStack_660 + lVar45 + 0x300) =
                     fVar68 * 4.0 + fVar84 + fVar76 * 8.0;
                *(float *)((long)afStack_660 + lVar45 + 0x304) =
                     fVar69 * 4.0 + fVar86 + fVar77 * 8.0;
                *(float *)((long)afStack_660 + lVar45 + 0x308) =
                     fVar70 * 4.0 + fVar88 + fVar78 * 8.0;
                *(float *)((long)afStack_660 + lVar45 + 0x30c) =
                     fVar71 * 4.0 + fVar90 + fVar79 * 8.0;
                *(float *)((long)afStack_660 + lVar45 + 0x310) =
                     fVar72 * 4.0 + fVar92 + fVar80 * 8.0;
                *(float *)((long)afStack_660 + lVar45 + 0x314) =
                     fVar73 * 4.0 + fVar94 + fVar81 * 8.0;
                *(float *)((long)afStack_660 + lVar45 + 0x318) =
                     fVar74 * 4.0 + fVar96 + fVar82 * 8.0;
                *(float *)((long)afStack_660 + lVar45 + 0x31c) = in_register_0000151c;
                *(float *)((long)afStack_660 + lVar45 + 0x400) =
                     fVar11 * 8.0 + fVar12 + fVar85 * 4.0;
                *(float *)((long)afStack_660 + lVar45 + 0x404) =
                     fVar13 * 8.0 + fVar14 + fVar87 * 4.0;
                *(float *)((long)afStack_660 + lVar45 + 0x408) =
                     fVar15 * 8.0 + fVar16 + fVar89 * 4.0;
                *(float *)((long)afStack_660 + lVar45 + 0x40c) =
                     fVar17 * 8.0 + fVar18 + fVar91 * 4.0;
                *(float *)((long)afStack_660 + lVar45 + 0x410) =
                     fVar19 * 8.0 + fVar20 + fVar93 * 4.0;
                *(float *)((long)afStack_660 + lVar45 + 0x414) =
                     fVar21 * 8.0 + fVar22 + fVar95 * 4.0;
                *(float *)((long)afStack_660 + lVar45 + 0x418) =
                     fVar23 * 8.0 + fVar24 + fVar97 * 4.0;
                *(float *)((long)afStack_660 + lVar45 + 0x41c) =
                     fVar98 + fVar26 + in_register_0000155c;
                *(float *)((long)afStack_660 + lVar45 + 0x500) =
                     fVar84 + fVar76 + fVar76 + fVar68 * 16.0;
                *(float *)((long)afStack_660 + lVar45 + 0x504) =
                     fVar86 + fVar77 + fVar77 + fVar69 * 16.0;
                *(float *)((long)afStack_660 + lVar45 + 0x508) =
                     fVar88 + fVar78 + fVar78 + fVar70 * 16.0;
                *(float *)((long)afStack_660 + lVar45 + 0x50c) =
                     fVar90 + fVar79 + fVar79 + fVar71 * 16.0;
                *(float *)((long)afStack_660 + lVar45 + 0x510) =
                     fVar92 + fVar80 + fVar80 + fVar72 * 16.0;
                *(float *)((long)afStack_660 + lVar45 + 0x514) =
                     fVar94 + fVar81 + fVar81 + fVar73 * 16.0;
                *(float *)((long)afStack_660 + lVar45 + 0x518) =
                     fVar96 + fVar82 + fVar82 + fVar74 * 16.0;
                *(float *)((long)afStack_660 + lVar45 + 0x51c) = fVar98 + fVar83 + fVar83 + fVar75;
                *(float *)((long)afStack_660 + lVar45 + 0x600) =
                     fVar85 + fVar11 * 32.0 + fVar12 + fVar60;
                *(float *)((long)afStack_660 + lVar45 + 0x604) =
                     fVar87 + fVar13 * 32.0 + fVar14 + fVar61;
                *(float *)((long)afStack_660 + lVar45 + 0x608) =
                     fVar89 + fVar15 * 32.0 + fVar16 + fVar62;
                *(float *)((long)afStack_660 + lVar45 + 0x60c) =
                     fVar91 + fVar17 * 32.0 + fVar18 + fVar63;
                *(float *)((long)afStack_660 + lVar45 + 0x610) =
                     fVar93 + fVar19 * 32.0 + fVar20 + fVar64;
                *(float *)((long)afStack_660 + lVar45 + 0x614) =
                     fVar95 + fVar21 * 32.0 + fVar22 + fVar65;
                *(float *)((long)afStack_660 + lVar45 + 0x618) =
                     fVar97 + fVar23 * 32.0 + fVar24 + fVar66;
                *(float *)((long)afStack_660 + lVar45 + 0x61c) =
                     auVar4._28_4_ + fVar25 + fVar26 + fVar67;
                lVar48 = lVar48 + (long)(iVar44 * 0x40) * 4;
                lVar45 = lVar45 + 0x20;
              } while (lVar45 != 0);
              pfVar49 = (float *)(((long)((uVar46 << 0x24) * 3) >> 0x1e) + local_848);
              lVar48 = 0xe0;
              do {
                auVar2 = *(undefined1 (*) [32])((long)local_720 + lVar48);
                auVar3 = *(undefined1 (*) [32])((long)&local_710.elemsize + lVar48);
                auVar4 = *(undefined1 (*) [32])((long)&local_710.h + lVar48);
                auVar5 = *(undefined1 (*) [32])((long)&local_6c0 + lVar48);
                auVar6 = *(undefined1 (*) [32])((long)&local_6a0 + lVar48);
                auVar7 = *(undefined1 (*) [32])((long)&local_680 + lVar48);
                auVar27 = vsubps_avx(auVar2,auVar3);
                fVar86 = auVar5._0_4_ + auVar4._0_4_;
                fVar88 = auVar5._4_4_ + auVar4._4_4_;
                fVar90 = auVar5._8_4_ + auVar4._8_4_;
                fVar92 = auVar5._12_4_ + auVar4._12_4_;
                fVar94 = auVar5._16_4_ + auVar4._16_4_;
                fVar96 = auVar5._20_4_ + auVar4._20_4_;
                fVar98 = auVar5._24_4_ + auVar4._24_4_;
                fVar99 = auVar5._28_4_ + auVar4._28_4_;
                auVar4 = vsubps_avx(auVar4,auVar5);
                fVar68 = auVar7._0_4_ + auVar6._0_4_;
                fVar69 = auVar7._4_4_ + auVar6._4_4_;
                fVar70 = auVar7._8_4_ + auVar6._8_4_;
                fVar71 = auVar7._12_4_ + auVar6._12_4_;
                fVar72 = auVar7._16_4_ + auVar6._16_4_;
                fVar73 = auVar7._20_4_ + auVar6._20_4_;
                fVar74 = auVar7._24_4_ + auVar6._24_4_;
                fVar75 = auVar7._28_4_ + auVar6._28_4_;
                auVar5 = vsubps_avx(auVar6,auVar7);
                fVar60 = auVar2._0_4_ + fVar52 + auVar3._0_4_;
                fVar61 = auVar2._4_4_ + fVar53 + auVar3._4_4_;
                fVar62 = auVar2._8_4_ + fVar54 + auVar3._8_4_;
                fVar63 = auVar2._12_4_ + fVar55 + auVar3._12_4_;
                fVar64 = auVar2._16_4_ + fVar56 + auVar3._16_4_;
                fVar65 = auVar2._20_4_ + fVar57 + auVar3._20_4_;
                fVar66 = auVar2._24_4_ + fVar58 + auVar3._24_4_;
                fVar67 = auVar2._28_4_ + fVar59 + auVar3._28_4_;
                fVar19 = *(float *)((long)&local_740 + lVar48 + 4);
                fVar20 = *(float *)((long)afStack_738 + lVar48);
                fVar21 = *(float *)((long)afStack_738 + lVar48 + 4);
                fVar22 = *(float *)((long)afStack_738 + lVar48 + 8);
                fVar23 = *(float *)((long)afStack_738 + lVar48 + 0xc);
                fVar24 = *(float *)((long)afStack_738 + lVar48 + 0x10);
                fVar25 = *(float *)((long)afStack_738 + lVar48 + 0x14);
                fVar83 = fVar99 + auVar7._28_4_;
                fVar11 = auVar4._0_4_;
                fVar12 = auVar4._4_4_;
                fVar13 = auVar4._8_4_;
                fVar14 = auVar4._12_4_;
                fVar15 = auVar4._16_4_;
                fVar16 = auVar4._20_4_;
                fVar17 = auVar4._24_4_;
                fVar18 = auVar4._28_4_;
                fVar76 = auVar5._0_4_;
                fVar77 = auVar5._4_4_;
                fVar78 = auVar5._8_4_;
                fVar79 = auVar5._12_4_;
                fVar80 = auVar5._16_4_;
                fVar81 = auVar5._20_4_;
                fVar82 = auVar5._24_4_;
                fVar85 = auVar27._0_4_ + fVar52;
                fVar87 = auVar27._4_4_ + fVar53;
                fVar89 = auVar27._8_4_ + fVar54;
                fVar91 = auVar27._12_4_ + fVar55;
                fVar93 = auVar27._16_4_ + fVar56;
                fVar95 = auVar27._20_4_ + fVar57;
                fVar97 = auVar27._24_4_ + fVar58;
                fVar84 = auVar27._28_4_ + fVar59;
                in_register_0000151c = fVar99 + fVar84 + in_register_0000155c;
                fVar26 = *(float *)((long)afStack_660 + lVar48);
                fVar29 = *(float *)((long)afStack_660 + lVar48 + 4);
                fVar30 = *(float *)((long)afStack_660 + lVar48 + 8);
                fVar31 = *(float *)((long)afStack_660 + lVar48 + 0xc);
                fVar32 = *(float *)((long)afStack_660 + lVar48 + 0x10);
                fVar33 = *(float *)((long)afStack_660 + lVar48 + 0x14);
                fVar34 = *(float *)((long)afStack_660 + lVar48 + 0x18);
                fVar35 = *(float *)((long)afStack_660 + lVar48 + 0x1c);
                pfVar49[-0x28] =
                     fVar86 + fVar68 * 32.0 + fVar60 + *(float *)((long)&local_740 + lVar48);
                pfVar49[-0x27] = fVar88 + fVar69 * 32.0 + fVar61 + fVar19;
                pfVar49[-0x26] = fVar90 + fVar70 * 32.0 + fVar62 + fVar20;
                pfVar49[-0x25] = fVar92 + fVar71 * 32.0 + fVar63 + fVar21;
                pfVar49[-0x24] = fVar94 + fVar72 * 32.0 + fVar64 + fVar22;
                pfVar49[-0x23] = fVar96 + fVar73 * 32.0 + fVar65 + fVar23;
                pfVar49[-0x22] = fVar98 + fVar74 * 32.0 + fVar66 + fVar24;
                pfVar49[-0x21] = fVar83 + fVar67 + fVar25;
                pfVar49[-0x20] = fVar11 + fVar11 + fVar85 + fVar76 * 16.0;
                pfVar49[-0x1f] = fVar12 + fVar12 + fVar87 + fVar77 * 16.0;
                pfVar49[-0x1e] = fVar13 + fVar13 + fVar89 + fVar78 * 16.0;
                pfVar49[-0x1d] = fVar14 + fVar14 + fVar91 + fVar79 * 16.0;
                pfVar49[-0x1c] = fVar15 + fVar15 + fVar93 + fVar80 * 16.0;
                pfVar49[-0x1b] = fVar16 + fVar16 + fVar95 + fVar81 * 16.0;
                pfVar49[-0x1a] = fVar17 + fVar17 + fVar97 + fVar82 * 16.0;
                pfVar49[-0x19] = fVar18 + fVar18 + fVar84 + fVar99;
                pfVar49[-0x18] = fVar86 * 4.0 + fVar60 + fVar68 * 8.0;
                pfVar49[-0x17] = fVar88 * 4.0 + fVar61 + fVar69 * 8.0;
                pfVar49[-0x16] = fVar90 * 4.0 + fVar62 + fVar70 * 8.0;
                pfVar49[-0x15] = fVar92 * 4.0 + fVar63 + fVar71 * 8.0;
                pfVar49[-0x14] = fVar94 * 4.0 + fVar64 + fVar72 * 8.0;
                pfVar49[-0x13] = fVar96 * 4.0 + fVar65 + fVar73 * 8.0;
                pfVar49[-0x12] = fVar98 * 4.0 + fVar66 + fVar74 * 8.0;
                pfVar49[-0x11] = fVar83 + fVar67 + in_register_0000155c;
                pfVar49[-0x10] = fVar11 * 8.0 + fVar85 + fVar76 * 4.0;
                pfVar49[-0xf] = fVar12 * 8.0 + fVar87 + fVar77 * 4.0;
                pfVar49[-0xe] = fVar13 * 8.0 + fVar89 + fVar78 * 4.0;
                pfVar49[-0xd] = fVar14 * 8.0 + fVar91 + fVar79 * 4.0;
                pfVar49[-0xc] = fVar15 * 8.0 + fVar93 + fVar80 * 4.0;
                pfVar49[-0xb] = fVar16 * 8.0 + fVar95 + fVar81 * 4.0;
                pfVar49[-10] = fVar17 * 8.0 + fVar97 + fVar82 * 4.0;
                pfVar49[-9] = in_register_0000151c;
                pfVar49[-8] = fVar86 * 16.0 + fVar68 + fVar68 + fVar60;
                pfVar49[-7] = fVar88 * 16.0 + fVar69 + fVar69 + fVar61;
                pfVar49[-6] = fVar90 * 16.0 + fVar70 + fVar70 + fVar62;
                pfVar49[-5] = fVar92 * 16.0 + fVar71 + fVar71 + fVar63;
                pfVar49[-4] = fVar94 * 16.0 + fVar72 + fVar72 + fVar64;
                pfVar49[-3] = fVar96 * 16.0 + fVar73 + fVar73 + fVar65;
                pfVar49[-2] = fVar98 * 16.0 + fVar74 + fVar74 + fVar66;
                pfVar49[-1] = fVar99 + fVar75 + fVar75 + fVar67;
                *pfVar49 = fVar76 + fVar85 + fVar11 * 32.0 + fVar26;
                pfVar49[1] = fVar77 + fVar87 + fVar12 * 32.0 + fVar29;
                pfVar49[2] = fVar78 + fVar89 + fVar13 * 32.0 + fVar30;
                pfVar49[3] = fVar79 + fVar91 + fVar14 * 32.0 + fVar31;
                pfVar49[4] = fVar80 + fVar93 + fVar15 * 32.0 + fVar32;
                pfVar49[5] = fVar81 + fVar95 + fVar16 * 32.0 + fVar33;
                pfVar49[6] = fVar82 + fVar97 + fVar17 * 32.0 + fVar34;
                pfVar49[7] = auVar5._28_4_ + fVar84 + fVar18 + fVar35;
                lVar48 = lVar48 + 0x100;
                pfVar49 = pfVar49 + local_830.w * 8;
              } while (lVar48 != 0x6e0);
              uVar46 = uVar46 + 1;
              lVar51 = lVar51 + 0x20;
            } while (uVar46 != local_7c8);
          }
          pMVar47 = (Mat *)((long)&local_7d0->data + 1);
          local_838 = local_838 + local_670;
          local_848 = local_848 + local_7d8;
        } while (pMVar47 != local_7e0);
      }
      lVar50 = local_7b8 + 1;
    } while (local_7b8 + 1 != local_678);
  }
  copy_cut_border(&local_830,local_7c0,0,local_830.h - local_7c0->h,0,local_830.w - local_7c0->w,opt
                 );
  piVar10 = (int *)CONCAT44(local_830.refcount._4_4_,local_830.refcount._0_4_);
  if (piVar10 != (int *)0x0) {
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 == 0) {
      if (local_830.allocator == (Allocator *)0x0) {
        if (local_830.data != (void *)0x0) {
          free(local_830.data);
        }
      }
      else {
        (*(local_830.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_830.cstep = 0;
  local_830.data = (void *)0x0;
  local_830.refcount._0_4_ = 0;
  local_830.refcount._4_4_ = 0;
  local_830.elemsize._0_4_ = 0;
  local_830.elemsize._4_4_ = 0;
  local_830.elempack = 0;
  local_830.dims = 0;
  local_830.w = 0;
  local_830.h = 0;
  local_830.d = 0;
  local_830.c = 0;
  piVar10 = (int *)CONCAT44(local_760._12_4_,local_760._8_4_);
  if (piVar10 != (int *)0x0) {
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 == 0) {
      if (local_740 == (Allocator *)0x0) {
        if ((void *)local_760._0_8_ != (void *)0x0) {
          free((void *)local_760._0_8_);
        }
      }
      else {
        (*local_740->_vptr_Allocator[3])();
      }
    }
  }
  local_720[0] = 0;
  local_760._0_8_ = (void *)0x0;
  local_760._8_4_ = 0;
  local_760._12_4_ = 0;
  local_760._16_4_ = 0;
  local_760._20_4_ = 0;
  local_760._24_4_ = 0;
  afStack_738[0] = 0.0;
  afStack_738[1] = 0.0;
  afStack_738[2] = 0.0;
  afStack_738[3] = 0.0;
  afStack_738[4] = 0.0;
  piVar10 = (int *)CONCAT44(local_710.refcount._4_4_,local_710.refcount._0_4_);
  if (piVar10 != (int *)0x0) {
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 == 0) {
      if (local_710.allocator == (Allocator *)0x0) {
        if (local_710.data != (void *)0x0) {
          free(local_710.data);
        }
      }
      else {
        (*(local_710.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_710.cstep = 0;
  local_710.data = (void *)0x0;
  local_710.refcount._0_4_ = 0;
  local_710.refcount._4_4_ = 0;
  local_710.elemsize._0_4_ = 0;
  local_710._20_8_ = 0;
  local_710.dims = 0;
  local_710.w = 0;
  local_710.h = 0;
  local_710.d = 0;
  local_710.c = 0;
  piVar10 = (int *)CONCAT44(local_7b0.refcount._4_4_,local_7b0.refcount._0_4_);
  if (piVar10 != (int *)0x0) {
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 == 0) {
      if (local_7b0.allocator == (Allocator *)0x0) {
        if (local_7b0.data != (void *)0x0) {
          free(local_7b0.data);
        }
      }
      else {
        (*(local_7b0.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd63_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Mat& bias, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;
    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    // pad to 6n+2
    Mat bottom_blob_bordered = bottom_blob;

    outw = (outw + 5) / 6 * 6;
    outh = (outh + 5) / 6 * 6;

    w = outw + 2;
    h = outh + 2;
    copy_make_border(bottom_blob, bottom_blob_bordered, 0, h - bottom_blob.h, 0, w - bottom_blob.w, BORDER_CONSTANT, 0.f, opt);

    // BEGIN transform input
    Mat bottom_blob_tm;
    {
        int w_tiles = outw / 6;
        int h_tiles = outh / 6;
        const int tiles = w_tiles * h_tiles;

        bottom_blob_tm.create(tiles, 64, inch, elemsize, elempack, opt.workspace_allocator);
        conv3x3s1_winograd63_transform_input_pack8_avx(bottom_blob_bordered, bottom_blob_tm, opt);
    }
    bottom_blob_bordered = Mat();
    // END transform input

    // BEGIN dot
    Mat top_blob_tm;
    convolution_winograd_dot_pack8_avx(bottom_blob_tm, outch, kernel_tm, top_blob_tm, opt);
    // END dot

    // BEGIN transform output
    Mat top_blob_bordered;
    if (outw == top_blob.w && outh == top_blob.h)
    {
        top_blob_bordered = top_blob;
    }
    else
    {
        top_blob_bordered.create(outw, outh, outch, elemsize, elempack, opt.workspace_allocator);
    }
    {
        conv3x3s1_winograd63_transform_output_pack8_avx(top_blob_tm, top_blob_bordered, bias, opt);
    }
    // END transform output

    // cut result pad
    copy_cut_border(top_blob_bordered, top_blob, 0, top_blob_bordered.h - top_blob.h, 0, top_blob_bordered.w - top_blob.w, opt);
}